

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall
spectest::CommandRunner::OnAssertExhaustionCommand
          (CommandRunner *this,AssertExhaustionCommand *command)

{
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  ActionResult result;
  long *local_90 [2];
  long local_80 [2];
  ActionResult local_70;
  
  RunAction(&local_70,this,(command->super_CommandMixin<(wabt::CommandType)10>).super_Command.line,
            &command->action,Quiet);
  if (local_70.trap.obj_ == (Trap *)0x0) {
    bVar3 = true;
  }
  else {
    local_90[0] = local_80;
    pcVar1 = ((local_70.trap.obj_)->message_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar1,pcVar1 + ((local_70.trap.obj_)->message_)._M_string_length)
    ;
    iVar2 = std::__cxx11::string::compare((char *)local_90);
    bVar3 = iVar2 != 0;
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
  }
  if (bVar3) {
    PrintError(this,(command->super_CommandMixin<(wabt::CommandType)10>).super_Command.line,
               "expected trap: \"%s\"",(command->text)._M_dataplus._M_p);
  }
  if (local_70.trap.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_70.trap.store_,local_70.trap.root_index_);
    local_70.trap.obj_ = (Trap *)0x0;
    local_70.trap.store_ = (Store *)0x0;
    local_70.trap.root_index_ = 0;
  }
  if (local_70.values.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.values.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)(uint)bVar3;
}

Assistant:

wabt::Result CommandRunner::OnAssertExhaustionCommand(
    const AssertExhaustionCommand* command) {
  ActionResult result =
      RunAction(command->line, &command->action, RunVerbosity::Quiet);
  if (!result.trap || result.trap->message() != "call stack exhausted") {
    PrintError(command->line, "expected trap: \"%s\"", command->text.c_str());
    return wabt::Result::Error;
  }

  // TODO: print message when assertion passes.
#if 0
  PrintError(command->line, "assert_exhaustion passed: %s",
             result.trap->message().c_str());
#endif
  return wabt::Result::Ok;
}